

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_value.c
# Opt level: O0

uchar metacall_value_cast_bool(void **v)

{
  uchar uVar1;
  type_id tVar2;
  undefined8 *in_RDI;
  value unaff_retaddr;
  value v_cast;
  type_id in_stack_00000064;
  value in_stack_00000068;
  value in_stack_fffffffffffffff0;
  
  tVar2 = value_type_id(unaff_retaddr);
  if ((tVar2 != 0) &&
     (in_stack_fffffffffffffff0 = value_type_cast(in_stack_00000068,in_stack_00000064),
     in_stack_fffffffffffffff0 != (value)0x0)) {
    *in_RDI = in_stack_fffffffffffffff0;
  }
  uVar1 = value_to_bool(in_stack_fffffffffffffff0);
  return uVar1;
}

Assistant:

boolean metacall_value_cast_bool(void **v)
{
	if (value_type_id(*v) != TYPE_BOOL)
	{
		value v_cast = value_type_cast(*v, TYPE_BOOL);

		if (v_cast != NULL)
		{
			*v = v_cast;
		}
	}

	return value_to_bool(*v);
}